

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupAssignmentRecord.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GroupAssignmentRecord::Decode(GroupAssignmentRecord *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  GroupAssignmentRecord *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x10) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar2 = KDataStream::operator>>(local_18,&this->m_ui32GrpBtField);
  pKVar2 = operator>>(pKVar2,(DataTypeBase *)&this->m_Entity);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16DstCommsDvcID);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui8DstLineID);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16Padding1);
  KDataStream::operator>>(pKVar2,&this->m_ui8Padding2);
  return;
}

Assistant:

void GroupAssignmentRecord::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GROUP_ASSIGNMENT_RECORD_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui32GrpBtField
           >> KDIS_STREAM m_Entity
           >> m_ui16DstCommsDvcID
           >> m_ui8DstLineID
           >> m_ui16Padding1
           >> m_ui8Padding2;
}